

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

Vec2 vkt::texture::util::calcLevelLodBounds(Vec2 *lodBounds,int level)

{
  Vec2 VVar1;
  Vec2 *levelLodBounds;
  float *in_RDI;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  fVar4 = lodBounds->m_data[0];
  fVar3 = (float)level;
  if (0.0 < fVar4) {
    fVar4 = (float)((uint)fVar4 & -(uint)(fVar3 <= fVar4) | ~-(uint)(fVar3 <= fVar4) & (uint)fVar3);
  }
  *in_RDI = fVar4;
  fVar3 = fVar3 + 1.0;
  uVar2 = -(uint)(lodBounds->m_data[1] <= fVar3);
  in_RDI[1] = (float)(~uVar2 & (uint)fVar3 | (uint)lodBounds->m_data[1] & uVar2);
  VVar1.m_data[1] = 0.0;
  VVar1.m_data[0] = fVar3;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 calcLevelLodBounds (const Vec2& lodBounds, int level)
{
	Vec2 levelLodBounds;

	if (lodBounds[0] <= 0.0f)
	{
		levelLodBounds[0] = lodBounds[0];
	}
	else
	{
		levelLodBounds[0] = de::max(lodBounds[0], (float) level);
	}

	levelLodBounds[1] = de::min(lodBounds[1], (float) level + 1.0f);

	return levelLodBounds;
}